

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_lib.cpp
# Opt level: O3

int waitIDE(lua_State *L)

{
  int iVar1;
  EmmyFacade *this;
  lua_Number lVar2;
  
  iVar1 = (*lua_gettop)(L);
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  else {
    lVar2 = (*luaL_checknumber)(L,1);
    iVar1 = (int)lVar2;
  }
  this = EmmyFacade::Get();
  EmmyFacade::WaitIDE(this,false,iVar1);
  return 0;
}

Assistant:

int waitIDE(lua_State* L)
{
	int top = lua_gettop(L);
	int timeout = 0;
	if (top >= 1)
	{
		timeout = static_cast<int>(luaL_checknumber(L, 1));
	}
	EmmyFacade::Get().WaitIDE(false, timeout);
	return 0;
}